

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall cnn::AdadeltaTrainer::update(AdadeltaTrainer *this,real scale)

{
  real *scalar;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *__return_storage_ptr__;
  Model *pMVar1;
  undefined8 *puVar2;
  Parameters *this_00;
  pointer pSVar3;
  LookupParameters *this_01;
  pointer pSVar4;
  real *prVar5;
  ulong uVar6;
  __node_base *p_Var7;
  ulong uVar8;
  Tensor *pTVar9;
  undefined8 *puVar10;
  ulong uVar11;
  Tensor *pTVar12;
  float fVar13;
  CwiseSqrtReturnType den;
  NegativeReturnType num;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  reg;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>
  delta;
  CwiseBinaryOp<_98512d73_> d2;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  g2;
  double local_9a0;
  uint local_994;
  real *local_990;
  real *local_988;
  undefined1 local_980 [16];
  pointer local_970 [3];
  float local_954;
  undefined8 *local_940;
  undefined8 *local_938;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_930;
  float local_90c;
  undefined8 uStack_900;
  undefined1 local_8f8;
  long local_8e0;
  undefined4 uStack_8d8;
  scalar_constant_op<float> sStack_8d4;
  undefined1 local_8d0 [56];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_898;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_860;
  StorageBaseType local_848 [24];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_830;
  undefined1 local_800 [28];
  scalar_constant_op<float> sStack_7e4;
  scalar_constant_op<float> sStack_7dc;
  undefined8 uStack_7d8;
  undefined1 local_7d0;
  variable_if_dynamic<long,__1> local_7b8;
  undefined4 uStack_7b0;
  scalar_constant_op<float> sStack_7ac;
  RhsNested local_7a8;
  undefined1 local_5b8 [16];
  XprTypeNested local_5a8;
  undefined1 local_4c8 [24];
  RhsNested local_4b0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_2c8;
  undefined1 local_290 [16];
  undefined1 local_280 [464];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  local_b0;
  
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_800,
               (this->super_Trainer).model);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::_M_move_assign
              (&this->hg,
               (vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_800);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_800);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               local_800,(this->super_Trainer).model);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::
    _M_move_assign(&this->hlg,
                   (vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                    *)local_800);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               local_800);
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_800,
               (this->super_Trainer).model);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::_M_move_assign
              (&this->hd,
               (vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_800);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_800);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               local_800,(this->super_Trainer).model);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::
    _M_move_assign(&this->hld,
                   (vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                    *)local_800);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               local_800);
    this->shadow_params_allocated = true;
  }
  fVar13 = Trainer::clip_gradients(&this->super_Trainer);
  pMVar1 = (this->super_Trainer).model;
  local_988 = &(this->super_Trainer).lambda;
  scalar = &this->rho;
  uVar11 = 0;
  local_990 = &this->epsilon;
  puVar2 = *(undefined8 **)(pMVar1 + 0x20);
  for (puVar10 = *(undefined8 **)(pMVar1 + 0x18); puVar10 != puVar2; puVar10 = puVar10 + 1) {
    this_00 = (Parameters *)*puVar10;
    local_4c8._0_4_ = fVar13 * scale;
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_800,
                &this_00->g);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)(local_8d0 + 0x38),(float *)local_4c8,(StorageBaseType *)local_800);
    pTVar12 = &(this->hg).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar11].h;
    pTVar9 = &(this->hd).
              super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar11].h;
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_800,
                &this_00->values);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator*
              (&local_830,
               (MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
               local_800,local_988);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
    ::
    cwiseProduct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)(local_280 + 0x1d0),
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                *)(local_8d0 + 0x38),
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)(local_8d0 + 0x38));
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_5b8,
                pTVar12);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)local_290,scalar,(StorageBaseType *)local_5b8);
    local_980._0_8_ = 1.0 - (double)this->rho;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
                      *)local_4c8,(double *)local_980,(StorageBaseType *)(local_280 + 0x1d0));
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                 *)local_800,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                 *)local_290,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                 *)local_4c8);
    Tensor::vec(&local_930,pTVar12);
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const>const>const>>
              (&local_930,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                *)local_800);
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_980,
                pTVar9);
    prVar5 = local_990;
    local_5a8._0_1_ = local_970[0]._0_1_;
    local_5b8._0_8_ = local_980._0_8_;
    local_5b8._8_8_ = local_980._8_8_;
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                 *)local_290,
                (ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>>
                 *)local_5b8,local_990);
    local_4b0._0_1_ = local_280[0];
    local_4c8._8_8_ = local_290._0_8_;
    local_4c8._16_8_ = local_290._8_8_;
    local_4b0.m_lhs._0_8_ = local_280._8_8_;
    local_4b0.m_lhs.m_lhs._4_4_ = local_280._20_4_;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
    ::
    cwiseProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>>
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                *)local_800,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                *)(local_8d0 + 0x38),
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                *)local_4c8);
    local_90c = sStack_7e4.m_other;
    uStack_900 = uStack_7d8;
    local_8f8 = local_7d0;
    local_8e0 = local_7b8.m_value;
    uStack_8d8 = uStack_7b0;
    sStack_8d4.m_other = sStack_7ac.m_other;
    local_8d0[0] = local_7a8._0_1_;
    local_8d0._8_8_ = local_7a8.m_lhs._0_8_;
    local_8d0._20_4_ = local_7a8.m_lhs.m_lhs._4_4_;
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_290,
                pTVar12);
    local_4c8[0x10] = local_280[0];
    local_4c8._0_8_ = local_290._0_8_;
    local_4c8._8_8_ = local_290._8_8_;
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                 *)local_800,
                (ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>>
                 *)local_4c8,prVar5);
    local_970[1]._0_1_ = local_800[0x10];
    local_980._8_8_ = local_800._0_8_;
    local_970[0] = (pointer)local_800._8_8_;
    local_954 = sStack_7dc.m_other;
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,-1,1,0,-1,1>const>const>const>const>const>const>>
    ::
    cwiseQuotient<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>>
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                *)local_5b8,&local_930,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                *)local_980);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,-1,1,0,-1,1>const>const>const>const>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,-1,1,0,-1,1>const>const>const>const>const>>
    ::
    cwiseProduct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>>
              ((CwiseBinaryOp<_98512d73_> *)local_290,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>>
                *)local_5b8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>
                *)local_5b8);
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                (local_8d0 + 0x88),pTVar9);
    Eigen::operator*(&local_2c8,scalar,(StorageBaseType *)(local_8d0 + 0x88));
    local_9a0 = 1.0 - (double)this->rho;
    Eigen::operator*((CwiseBinaryOp<_5ec0dc6e_> *)local_4c8,&local_9a0,(StorageBaseType *)local_290)
    ;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
    ::operator+((CwiseBinaryOp<_cf4084d1_> *)local_800,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                 *)&local_2c8,(MatrixBase<_877d0c49_> *)local_4c8);
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                (local_8d0 + 0x70),pTVar9);
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<f____constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>const>const>const>>
              ((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
               (local_8d0 + 0x70),(CwiseBinaryOp<_cf4084d1_> *)local_800);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,-1,1,0,-1,1>const>const>const>const>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,-1,1,0,-1,1>const>const>const>const>const>>
    ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                 *)local_800,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>>
                 *)local_5b8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                 *)&local_830);
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_4c8,
                &this_00->values);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
               local_4c8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                *)local_800);
    Parameters::clear(this_00);
    uVar11 = (ulong)((int)uVar11 + 1);
  }
  pMVar1 = (this->super_Trainer).model;
  local_940 = *(undefined8 **)(pMVar1 + 0x38);
  local_994 = 0;
  for (local_938 = *(undefined8 **)(pMVar1 + 0x30); local_938 != local_940;
      local_938 = local_938 + 1) {
    pSVar3 = (this->hlg).
             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_01 = (LookupParameters *)*local_938;
    uVar11 = (ulong)local_994;
    pSVar4 = (this->hld).
             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (ulong)local_994;
    p_Var7 = &(this_01->non_zero_grads)._M_h._M_before_begin;
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      uVar8 = (ulong)(uint)*(size_type *)(p_Var7 + 1);
      local_4c8._0_4_ = fVar13 * scale;
      pTVar12 = (Tensor *)
                (*(long *)&pSVar3[uVar11].h.
                           super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
                uVar8 * 0x48);
      pTVar9 = (Tensor *)
               (*(long *)&pSVar4[uVar6].h.
                          super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
               uVar8 * 0x48);
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_800,
                  (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar8);
      __return_storage_ptr__ =
           (CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
            *)(local_8d0 + 0x38);
      Eigen::operator*(__return_storage_ptr__,(float *)local_4c8,(StorageBaseType *)local_800);
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_800,
                  (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar8);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator*(&local_830,
                (MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
                local_800,local_988);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
      ::
      cwiseProduct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)(local_280 + 0x1d0),
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                  *)__return_storage_ptr__,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)__return_storage_ptr__);
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_5b8,
                  pTVar12);
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)local_290,scalar,(StorageBaseType *)local_5b8);
      local_980._0_8_ = 1.0 - (double)*scalar;
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
                        *)local_4c8,(double *)local_980,(StorageBaseType *)(local_280 + 0x1d0));
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                   *)local_800,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                   *)local_290,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                   *)local_4c8);
      Tensor::vec(&local_930,pTVar12);
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const>const>const>>
                (&local_930,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                  *)local_800);
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_980,
                  pTVar9);
      prVar5 = local_990;
      local_5a8._0_1_ = local_970[0]._0_1_;
      local_5b8._0_8_ = local_980._0_8_;
      local_5b8._8_8_ = local_980._8_8_;
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                   *)local_290,
                  (ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>>
                   *)local_5b8,local_990);
      local_4b0._0_1_ = local_280[0];
      local_4c8._8_8_ = local_290._0_8_;
      local_4c8._16_8_ = local_290._8_8_;
      local_4b0.m_lhs._0_8_ = local_280._8_8_;
      local_4b0.m_lhs.m_lhs._4_4_ = local_280._20_4_;
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
      ::
      cwiseProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                  *)local_800,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                  *)(local_8d0 + 0x38),
                 (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                  *)local_4c8);
      local_90c = sStack_7e4.m_other;
      uStack_900 = uStack_7d8;
      local_8f8 = local_7d0;
      local_8e0 = local_7b8.m_value;
      uStack_8d8 = uStack_7b0;
      sStack_8d4.m_other = sStack_7ac.m_other;
      local_8d0[0] = local_7a8._0_1_;
      local_8d0._8_8_ = local_7a8.m_lhs._0_8_;
      local_8d0._20_4_ = local_7a8.m_lhs.m_lhs._4_4_;
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_290,
                  pTVar12);
      local_4c8[0x10] = local_280[0];
      local_4c8._0_8_ = local_290._0_8_;
      local_4c8._8_8_ = local_290._8_8_;
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                   *)local_800,
                  (ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>>
                   *)local_4c8,prVar5);
      local_970[1]._0_1_ = local_800[0x10];
      local_980._8_8_ = local_800._0_8_;
      local_970[0] = (pointer)local_800._8_8_;
      local_954 = sStack_7dc.m_other;
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,-1,1,0,-1,1>const>const>const>const>const>const>>
      ::
      cwiseQuotient<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>>
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                  *)local_5b8,&local_930,
                 (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                  *)local_980);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,-1,1,0,-1,1>const>const>const>const>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,-1,1,0,-1,1>const>const>const>const>const>>
      ::
      cwiseProduct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>>
                ((CwiseBinaryOp<_98512d73_> *)local_290,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>>
                  *)local_5b8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>
                  *)local_5b8);
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                  (local_8d0 + 0x88),pTVar9);
      Eigen::operator*(&local_2c8,scalar,(StorageBaseType *)(local_8d0 + 0x88));
      local_9a0 = 1.0 - (double)*scalar;
      Eigen::operator*((CwiseBinaryOp<_5ec0dc6e_> *)local_4c8,&local_9a0,
                       (StorageBaseType *)local_290);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
      ::operator+((CwiseBinaryOp<_cf4084d1_> *)local_800,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                   *)&local_2c8,(MatrixBase<_877d0c49_> *)local_4c8);
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                  (local_8d0 + 0x70),pTVar9);
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<f____constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>const>const>const>>
                ((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 (local_8d0 + 0x70),(CwiseBinaryOp<_cf4084d1_> *)local_800);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,-1,1,0,-1,1>const>const>const>const>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,-1,1,0,-1,1>const>const>const>const>const>>
      ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                   *)local_800,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,_1,1,0,_1,1>const>const>const>const>const>>
                   *)local_5b8,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                   *)&local_830);
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_4c8,
                  (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar8);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
                 local_4c8,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                  *)local_800);
    }
    LookupParameters::clear(this_01);
    local_994 = local_994 + 1;
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
}

Assistant:

void AdadeltaTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    hg = AllocateShadowParameters(*model);
    hlg = AllocateShadowLookupParameters(*model);
    hd = AllocateShadowParameters(*model);
    hld = AllocateShadowLookupParameters(*model);

    /*pi = 0;
    for (auto p : model->parameters_list()) {
      TensorTools::Constant(hg[pi].h, epsilon);
      TensorTools::Constant(hd[pi].h, epsilon);
      ++pi;
    }

    pi = 0;
    for (auto p : model->lookup_parameters_list()) {
      vector<Tensor>& hgx = hlg[pi].h;
      vector<Tensor>& hdx = hld[pi].h;
      for (unsigned i = 0; i < hgx.size(); ++i) {
        TensorTools::Constant(hgx[i], epsilon);
        TensorTools::Constant(hdx[i], epsilon);
      }
      ++pi;
    }*/

    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  for (auto p : model->parameters_list()) {
    auto& g = (scale * gscale) * p->g.vec();
    Tensor& hgv = hg[pi].h;
    Tensor& hdv = hd[pi].h;
    auto reg = p->values.vec() * lambda;
    auto g2 = g.cwiseProduct(g);
    hgv.vec() = rho * hgv.vec() + (1.0 - rho) * g2;
    auto num = -g.cwiseProduct((hdv.vec().array() + epsilon).matrix().cwiseSqrt());
    auto den = (hgv.vec().array() + epsilon).matrix().cwiseSqrt();
    auto delta = num.cwiseQuotient(den);
    auto d2 = delta.cwiseProduct(delta);
    hdv.vec() = rho * hdv.vec() + (1.0 - rho) * d2;
    p->values.vec() += delta - reg;
    p->clear();
    pi++;
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& hgvx = hlg[pi].h;
    vector<Tensor>& hdvx = hld[pi].h;
    for (auto i : p->non_zero_grads) {
      Tensor& hgv = hgvx[i];
      Tensor& hdv = hdvx[i];
      auto& g = scale * gscale * p->grads[i].vec();
      auto reg = p->values[i].vec() * lambda;
      auto g2 = g.cwiseProduct(g);
      hgv.vec() = rho * hgv.vec() + (1.0 - rho) * g2;
      auto num = -g.cwiseProduct((hdv.vec().array() + epsilon).matrix().cwiseSqrt());
      auto den = (hgv.vec().array() + epsilon).matrix().cwiseSqrt();
      auto delta = num.cwiseQuotient(den);
      auto d2 = delta.cwiseProduct(delta);
      hdv.vec() = rho * hdv.vec() + (1.0 - rho) * d2;
      p->values[i].vec() += delta - reg;
    }
    p->clear();
    pi++;
  }
  ++updates;
}